

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::TemplateContext::getScopeMap
          (map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
           *__return_storage_ptr__,TemplateContext *this)

{
  _Rb_tree_header *p_Var1;
  ListReader *pLVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Reader params;
  PointerReader local_78;
  ListReader local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    if ((this->node)._reader.pointerCount < 6) {
      uVar3 = 0;
      uVar4 = 0;
      local_78.capTable._0_4_ = 0;
      local_78.capTable._4_4_ = 0;
      local_78.nestingLimit = 0x7fffffff;
      local_78.pointer = (WirePointer *)0x0;
    }
    else {
      uVar3 = *(undefined4 *)&(this->node)._reader.segment;
      uVar4 = *(undefined4 *)((long)&(this->node)._reader.segment + 4);
      local_78.capTable._0_4_ = *(undefined4 *)&(this->node)._reader.capTable;
      local_78.capTable._4_4_ = *(undefined4 *)((long)&(this->node)._reader.capTable + 4);
      local_78.pointer = (this->node)._reader.pointers + 5;
      local_78.nestingLimit = (this->node)._reader.nestingLimit;
    }
    local_78.segment = (SegmentReader *)CONCAT44(uVar4,uVar3);
    pLVar2 = _::PointerReader::getList(&local_50,&local_78,INLINE_COMPOSITE,(word *)0x0);
    if (local_50.elementCount != 0) {
      if ((this->node)._reader.dataSize < 0x40) {
        local_78.segment = (SegmentReader *)0x0;
      }
      else {
        local_78.segment = *(this->node)._reader.data;
      }
      pLVar2 = &std::
                map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
                ::operator[](__return_storage_ptr__,(key_type *)&local_78)->reader;
      pLVar2->structDataSize = local_50.structDataSize;
      pLVar2->structPointerCount = local_50.structPointerCount;
      pLVar2->elementSize = local_50.elementSize;
      pLVar2->field_0x27 = local_50._39_1_;
      pLVar2->nestingLimit = local_50.nestingLimit;
      *(undefined4 *)&pLVar2->field_0x2c = local_50._44_4_;
      pLVar2->ptr = local_50.ptr;
      pLVar2->elementCount = local_50.elementCount;
      pLVar2->step = local_50.step;
      pLVar2->segment = local_50.segment;
      pLVar2->capTable = local_50.capTable;
    }
    this = (this->parent).ptr;
  } while (this != (TemplateContext *)0x0);
  return (map<unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader>_>_>
          *)pLVar2;
}

Assistant:

std::map<uint64_t, List<schema::Node::Parameter>::Reader> getScopeMap() const {
      std::map<uint64_t, List<schema::Node::Parameter>::Reader> result;
      const TemplateContext* current = this;
      for (;;) {
        auto params = current->node.getParameters();
        if (params.size() > 0) {
          result[current->node.getId()] = params;
        }
        KJ_IF_MAYBE(p, current->parent) {
          current = p;
        } else {
          return result;
        }
      }
    }